

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O0

bool __thiscall axl::io::ShmtBase::initializeMapping(ShmtBase *this,size_t size,bool isForced)

{
  bool bVar1;
  int iVar2;
  Module *this_00;
  SystemInfo *pSVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  byte in_DL;
  ulong uVar6;
  ulong in_RSI;
  long in_RDI;
  void *p;
  uint64_t fileSize;
  bool result;
  size_t remSize;
  SystemInfo *systemInfo;
  uint64_t in_stack_ffffffffffffff78;
  File *in_stack_ffffffffffffff80;
  uint_t in_stack_ffffffffffffffac;
  ErrorRef *in_stack_ffffffffffffffb0;
  ulong local_18;
  long lVar5;
  
  this_00 = g::getModule();
  pSVar3 = g::Module::getSystemInfo(this_00);
  uVar6 = in_RSI % pSVar3->m_pageSize;
  local_18 = in_RSI;
  if (uVar6 != 0) {
    local_18 = (in_RSI - uVar6) + pSVar3->m_pageSize;
  }
  if ((in_DL & 1) == 0) {
    uVar4 = File::getSize((File *)0x14a6de);
    if (uVar4 < local_18) {
      err::ErrorRef::ErrorRef(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      err::setError((ErrorRef *)0x14a70d);
      err::ErrorRef::~ErrorRef((ErrorRef *)0x14a719);
      return false;
    }
  }
  else {
    bVar1 = File::setSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      return false;
    }
  }
  iVar2 = Mapping::open((Mapping *)(in_RDI + 8),(char *)(in_RDI + 4),0,local_18,0);
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (lVar5 != 0) {
    *(long *)(in_RDI + 0x50) = lVar5;
    *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x50) + 0x28;
  }
  return lVar5 != 0;
}

Assistant:

bool
ShmtBase::initializeMapping(
	size_t size,
	bool isForced
) {
	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size_t remSize = size % systemInfo->m_pageSize;
	if (remSize)
		size = size - remSize + systemInfo->m_pageSize;

	if (isForced) {
		bool result = m_file.setSize(size);
		if (!result)
			return false;
	} else {
		uint64_t fileSize = m_file.getSize();
		if (fileSize < size) {
			err::setError(err::SystemErrorCode_InvalidParameter);
			return false;
		}
	}

	void* p = m_mapping.open(&m_file, 0, size);
	if (!p)
		return false;

	m_hdr = (ShmtFileHdr*)p;
	m_data = (char*)(m_hdr + 1);
	return true;
}